

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission.cpp
# Opt level: O1

void __thiscall DIntermissionScreenCast::PlayAttackSound(DIntermissionScreenCast *this)

{
  FICastSound *pFVar1;
  ulong uVar2;
  ulong uVar3;
  undefined8 uStack_18;
  
  uStack_18 = this->caststate;
  if (((uStack_18 != (FState *)0x0) && (this->castattacking == true)) &&
     (uVar2 = (ulong)(this->mCastSounds).Count, uVar2 != 0)) {
    pFVar1 = (this->mCastSounds).Array;
    uVar3 = 0;
    do {
      if (((pFVar1[uVar3].mSequence != '\0') != (this->basestate == this->mDefaults->MissileState))
         && (uStack_18 == this->basestate + pFVar1[uVar3].mIndex)) {
        S_StopAllChannels();
        uStack_18 = (FState *)
                    CONCAT44((this->mCastSounds).Array[uVar3].mSound.ID,(undefined4)uStack_18);
        S_Sound(0x21,(FSoundID *)((long)&uStack_18 + 4),1.0,0.0);
        return;
      }
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  return;
}

Assistant:

void DIntermissionScreenCast::PlayAttackSound()
{
	// sound hacks....
	if (caststate != NULL && castattacking)
	{
		for (unsigned i = 0; i < mCastSounds.Size(); i++)
		{
			if ((!!mCastSounds[i].mSequence) == (basestate != mDefaults->MissileState) &&
				(caststate == basestate + mCastSounds[i].mIndex))
			{
				S_StopAllChannels ();
				S_Sound (CHAN_WEAPON | CHAN_UI, mCastSounds[i].mSound, 1, ATTN_NONE);
				return;
			}
		}
	}

}